

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O0

VertexHandle __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::add_vertex
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,Vec3f *_point)

{
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  *this_00;
  BaseHandle BVar1;
  VectorT<float,_3> *in_RDX;
  return_type local_38;
  Vec3f *local_20;
  Vec3f *_point_local;
  ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this_local;
  
  this_00 = (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
             *)this->mesh_;
  local_20 = _point;
  _point_local = (Vec3f *)this;
  vector_cast<OpenMesh::VectorT<double,3>,OpenMesh::VectorT<float,3>>
            (&local_38,(OpenMesh *)_point,in_RDX);
  BVar1.idx_ = (int)PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                    ::add_vertex(this_00,&local_38);
  return (BaseHandle)(BaseHandle)BVar1.idx_;
}

Assistant:

virtual VertexHandle add_vertex(const Vec3f& _point)
  {
    return mesh_.add_vertex(vector_cast<Point>(_point));
  }